

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O1

mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
* __thiscall
ising::tc::
square<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
           *__return_storage_ptr__,tc *this,
          mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
          *Jx,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *Jy)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *pmVar9;
  tc tVar10;
  bool bVar11;
  int iVar12;
  cpp_dec_float<100U,_int,_void> *pcVar13;
  runtime_error *this_00;
  code *pcVar14;
  undefined *puVar15;
  long lVar16;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  xn;
  autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_1UL>
  vn;
  autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_1UL>
  v;
  multiply_immediates local_7e9;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  uint local_7d8;
  uint uStack_7d4;
  uint uStack_7d0;
  uint uStack_7cc;
  uint local_7c8;
  uint uStack_7c4;
  uint uStack_7c0;
  uint uStack_7bc;
  uint local_7b8;
  uint uStack_7b4;
  undefined5 uStack_7b0;
  undefined3 uStack_7ab;
  int iStack_7a8;
  char cStack_7a4;
  undefined8 local_7a0;
  long local_790;
  type local_788;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnStack_780;
  uint local_778;
  uint uStack_774;
  uint uStack_770;
  uint uStack_76c;
  uint local_768;
  uint uStack_764;
  uint uStack_760;
  uint uStack_75c;
  uint local_758;
  uint uStack_754;
  uint uStack_750;
  uint uStack_74c;
  int local_748;
  char local_744;
  fpclass_type local_740;
  int32_t iStack_73c;
  undefined1 local_738 [8];
  type pnStack_730;
  uint local_728 [11];
  undefined3 uStack_6fb;
  int iStack_6f8;
  bool bStack_6f4;
  undefined8 local_6f0;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *local_690;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_688;
  type local_638;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnStack_630;
  uint local_628;
  uint uStack_624;
  uint uStack_620;
  uint uStack_61c;
  uint local_618;
  uint uStack_614;
  uint uStack_610;
  uint uStack_60c;
  uint local_608;
  uint uStack_604;
  uint uStack_600;
  uint uStack_5fc;
  int local_5f8;
  bool local_5f4;
  fpclass_type local_5f0;
  int32_t iStack_5ec;
  long local_5e8;
  expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_5d8;
  undefined1 local_5c8 [16];
  uint local_5b8 [2];
  uint auStack_5b0 [2];
  uint local_5a8 [2];
  uint auStack_5a0 [2];
  uint local_598 [2];
  uint auStack_590 [2];
  int local_588;
  bool local_584;
  fpclass_type local_580;
  int32_t iStack_57c;
  undefined1 local_578 [16];
  uint local_568 [2];
  uint auStack_560 [2];
  uint local_558 [2];
  uint auStack_550 [2];
  uint local_548 [2];
  uint auStack_540 [2];
  int local_538;
  bool local_534;
  fpclass_type local_530;
  int32_t iStack_52c;
  uint local_528 [2];
  uint auStack_520 [2];
  uint local_518 [2];
  uint auStack_510 [2];
  uint local_508 [2];
  uint uStack_500;
  uint uStack_4fc;
  uint uStack_4f8;
  uint auStack_4f4 [3];
  expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_4e8;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  int local_4a8;
  undefined1 local_4a4;
  undefined8 local_4a0;
  undefined1 local_498 [12];
  uint uStack_48c;
  uint uStack_488;
  uint local_484 [2];
  uint auStack_47c [2];
  uint auStack_474 [5];
  uint auStack_460 [2];
  int local_458;
  bool local_454;
  fpclass_type local_450;
  int32_t iStack_44c;
  type local_448;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnStack_440;
  uint local_438 [2];
  uint auStack_430 [2];
  uint local_428 [2];
  uint auStack_420 [2];
  uint local_418 [2];
  uint auStack_410 [2];
  int local_408;
  bool local_404;
  fpclass_type local_400;
  int32_t local_3fc;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_3f8;
  cpp_dec_float<100U,_int,_void> local_3a8;
  cpp_dec_float<100U,_int,_void> local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_308;
  undefined1 local_2b8 [8];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnStack_2b0;
  uint local_2a8 [11];
  undefined3 uStack_27b;
  int iStack_278;
  bool bStack_274;
  undefined8 local_270;
  uint local_218 [5];
  uint local_204 [2];
  uint auStack_1fc [2];
  uint local_1f4 [5];
  uint auStack_1e0 [2];
  int local_1d8;
  char local_1d4;
  fpclass_type local_1d0;
  int32_t iStack_1cc;
  undefined1 local_1c8 [16];
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  uint local_198 [2];
  uint auStack_190 [2];
  int local_188;
  tc local_184;
  undefined8 local_180;
  uint local_178 [2];
  uint auStack_170 [2];
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  uint auStack_150 [2];
  uint local_148 [2];
  uint auStack_140 [2];
  int local_138;
  bool local_134;
  undefined8 local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_128;
  undefined1 local_d8 [16];
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [2];
  uint auStack_a0 [2];
  int local_98;
  bool local_94;
  fpclass_type local_90;
  int32_t iStack_8c;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_88;
  
  tVar10 = this[0x44];
  if (tVar10 == (tc)0x1) {
    tVar10 = (tc)(*(int *)this == 0 && *(int *)(this + 0x48) == 0);
  }
  this[0x44] = tVar10;
  bVar11 = (Jx->base).m_backend.neg;
  if (bVar11 == true) {
    bVar11 = (Jx->base).m_backend.data._M_elems[0] == 0 &&
             (Jx->base).m_backend.fpclass == cpp_dec_float_finite;
  }
  (Jx->base).m_backend.neg = bVar11;
  local_270._0_4_ = cpp_dec_float_finite;
  local_270._4_4_ = 0x10;
  local_2b8 = (undefined1  [8])0x0;
  pnStack_2b0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                 *)0x0;
  local_2a8[0] = 0;
  local_2a8[1] = 0;
  local_2a8[2] = 0;
  local_2a8[3] = 0;
  local_2a8[4] = 0;
  local_2a8[5] = 0;
  local_2a8[6] = 0;
  local_2a8[7] = 0;
  local_2a8[8] = 0;
  local_2a8[9] = 0;
  stack0xfffffffffffffd80 = 0;
  uStack_27b = 0;
  iStack_278 = 0;
  bStack_274 = false;
  local_690 = __return_storage_ptr__;
  local_1c8._0_8_ = this;
  local_1c8._8_8_ = Jx;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  ::
  do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              *)local_2b8,
             (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
              *)local_1c8,(multiply_immediates *)local_738);
  local_738 = local_2b8;
  pnStack_730 = pnStack_2b0;
  local_728[0] = local_2a8[0];
  local_728[1] = local_2a8[1];
  local_728[2] = local_2a8[2];
  local_728[3] = local_2a8[3];
  local_728[4] = local_2a8[4];
  local_728[5] = local_2a8[5];
  local_728[6] = local_2a8[6];
  local_728[7] = local_2a8[7];
  local_728[8] = local_2a8[8];
  local_728[9] = local_2a8[9];
  stack0xfffffffffffff900 = stack0xfffffffffffffd80;
  uStack_6fb = uStack_27b;
  iStack_6f8 = iStack_278;
  bStack_6f4 = bStack_274;
  local_6f0._0_4_ = (fpclass_type)local_270;
  local_6f0._4_4_ = local_270._4_4_;
  local_2b8 = (undefined1  [8])((ulong)local_2b8 & 0xffffffff00000000);
  bVar11 = operator<=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)local_738,(int *)local_2b8);
  if (bVar11) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this_00,"Jx * Jy should be non-zero");
    puVar15 = &std::invalid_argument::typeinfo;
    pcVar14 = std::invalid_argument::~invalid_argument;
  }
  else {
    local_1c8._0_8_ = *(undefined8 *)this;
    local_1c8._8_8_ = *(undefined8 *)(this + 8);
    local_1b8 = *(uint (*) [2])(this + 0x10);
    auStack_1b0 = *(uint (*) [2])(this + 0x18);
    local_1a8 = *(uint (*) [2])(this + 0x20);
    auStack_1a0 = *(uint (*) [2])(this + 0x28);
    local_198 = *(uint (*) [2])(this + 0x30);
    auStack_190 = *(uint (*) [2])(this + 0x38);
    local_188 = *(int *)(this + 0x40);
    local_184 = this[0x44];
    local_180 = *(undefined8 *)(this + 0x48);
    local_178 = *(uint (*) [2])(Jx->base).m_backend.data._M_elems;
    auStack_170 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 2);
    local_168 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 4);
    auStack_160 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 6);
    local_158 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 8);
    auStack_150 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 10);
    local_148 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 0xc);
    auStack_140 = *(uint (*) [2])((Jx->base).m_backend.data._M_elems + 0xe);
    local_138 = (Jx->base).m_backend.exp;
    local_134 = (Jx->base).m_backend.neg;
    local_130._0_4_ = (Jx->base).m_backend.fpclass;
    local_130._4_4_ = (Jx->base).m_backend.prec_elem;
    local_270._0_4_ = cpp_dec_float_finite;
    local_270._4_4_ = 0x10;
    local_2b8._0_4_ = 0;
    local_2b8._4_4_ = 0;
    pnStack_2b0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                   *)0x0;
    local_2a8[0] = 0;
    local_2a8[1] = 0;
    local_2a8[2] = 0;
    local_2a8[3] = 0;
    local_2a8[4] = 0;
    local_2a8[5] = 0;
    local_2a8[6] = 0;
    local_2a8[7] = 0;
    local_2a8[8] = 0;
    local_2a8[9] = 0;
    stack0xfffffffffffffd80 = 0;
    uStack_27b = 0;
    iStack_278 = 0;
    bStack_274 = false;
    local_738 = (undefined1  [8])this;
    pnStack_730 = &Jx->base;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
    ::
    do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
              ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                *)local_2b8,
               (expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                *)local_738,(add_immediates *)&local_7e8);
    local_128.m_backend.data._M_elems[0xf]._1_3_ = uStack_27b;
    local_128.m_backend.data._M_elems._56_5_ = stack0xfffffffffffffd80;
    pnStack_730 = &local_128;
    local_128.m_backend.data._M_elems[0] = local_2b8._0_4_;
    local_128.m_backend.data._M_elems[1] = local_2b8._4_4_;
    local_128.m_backend.data._M_elems._8_8_ = pnStack_2b0;
    local_128.m_backend.data._M_elems[4] = local_2a8[0];
    local_128.m_backend.data._M_elems[5] = local_2a8[1];
    local_128.m_backend.data._M_elems[6] = local_2a8[2];
    local_128.m_backend.data._M_elems[7] = local_2a8[3];
    local_128.m_backend.data._M_elems[8] = local_2a8[4];
    local_128.m_backend.data._M_elems[9] = local_2a8[5];
    local_128.m_backend.data._M_elems[10] = local_2a8[6];
    local_128.m_backend.data._M_elems[0xb] = local_2a8[7];
    local_128.m_backend.data._M_elems[0xc] = local_2a8[8];
    local_128.m_backend.data._M_elems[0xd] = local_2a8[9];
    local_128.m_backend.exp = iStack_278;
    local_128.m_backend.neg = bStack_274;
    local_128.m_backend.fpclass = (fpclass_type)local_270;
    local_128.m_backend.prec_elem = local_270._4_4_;
    local_738._0_4_ = 2;
    local_270._0_4_ = cpp_dec_float_finite;
    local_270._4_4_ = 0x10;
    local_2b8 = (undefined1  [8])0x0;
    pnStack_2b0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                   *)0x0;
    local_2a8[0] = 0;
    local_2a8[1] = 0;
    local_2a8[2] = 0;
    local_2a8[3] = 0;
    local_2a8[4] = 0;
    local_2a8[5] = 0;
    local_2a8[6] = 0;
    local_2a8[7] = 0;
    local_2a8[8] = 0;
    local_2a8[9] = 0;
    stack0xfffffffffffffd80 = 0;
    uStack_27b = 0;
    iStack_278 = 0;
    bStack_274 = false;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
    ::
    do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
              ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                *)local_2b8,
               (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                *)local_738,(multiply_immediates *)&local_7e8);
    auStack_a0[1]._1_3_ = uStack_27b;
    auStack_a0._0_5_ = stack0xfffffffffffffd80;
    local_d8._0_8_ = local_2b8;
    local_d8._8_8_ = pnStack_2b0;
    local_c8[0] = local_2a8[0];
    local_c8[1] = local_2a8[1];
    auStack_c0[0] = local_2a8[2];
    auStack_c0[1] = local_2a8[3];
    local_b8[0] = local_2a8[4];
    local_b8[1] = local_2a8[5];
    auStack_b0[0] = local_2a8[6];
    auStack_b0[1] = local_2a8[7];
    local_a8[0] = local_2a8[8];
    local_a8[1] = local_2a8[9];
    local_98 = iStack_278;
    local_94 = bStack_274;
    local_90 = (fpclass_type)local_270;
    iStack_8c = local_270._4_4_;
    operator/(&local_688,1,
              (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               *)local_d8);
    local_88.base.m_backend.data._M_elems[0xe] = local_688.base.m_backend.data._M_elems[0xe];
    local_88.base.m_backend.data._M_elems[0xf] = local_688.base.m_backend.data._M_elems[0xf];
    local_88.base.m_backend.exp = local_688.base.m_backend.exp;
    local_88.base.m_backend.neg = local_688.base.m_backend.neg;
    anon_unknown.dwarf_d4794::
    func<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::operator()((autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_1UL>
                  *)local_2b8,
                 (func<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                  *)local_1c8,&local_88);
    lVar16 = 0;
    do {
      local_790 = lVar16;
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
      ::derivative<int>((get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_1UL>,_sizeof___(Orders)>
                         *)&local_358,
                        (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
                         *)local_2b8,0);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
      ::derivative<int>((get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_1UL>,_sizeof___(Orders)>
                         *)local_5c8,
                        (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
                         *)local_2b8,1);
      local_6f0._0_4_ = cpp_dec_float_finite;
      local_6f0._4_4_ = 0x10;
      local_738 = (undefined1  [8])0x0;
      pnStack_730 = (type)0x0;
      local_728[0] = 0;
      local_728[1] = 0;
      local_728[2] = 0;
      local_728[3] = 0;
      local_728[4] = 0;
      local_728[5] = 0;
      local_728[6] = 0;
      local_728[7] = 0;
      local_728[8] = 0;
      local_728[9] = 0;
      stack0xfffffffffffff900 = 0;
      uStack_6fb = 0;
      iStack_6f8 = 0;
      bStack_6f4 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)local_738,&local_358,
                 (cpp_dec_float<100U,_int,_void> *)local_5c8);
      local_7b8 = (uint)local_728._32_8_;
      uStack_7b4 = SUB84(local_728._32_8_,4);
      uStack_7b0 = stack0xfffffffffffff900;
      uStack_7ab = uStack_6fb;
      local_7c8 = (uint)local_728._16_8_;
      uStack_7c4 = SUB84(local_728._16_8_,4);
      uStack_7c0 = (uint)local_728._24_8_;
      uStack_7bc = SUB84(local_728._24_8_,4);
      local_7d8 = (uint)local_728._0_8_;
      uStack_7d4 = SUB84(local_728._0_8_,4);
      uStack_7d0 = (uint)local_728._8_8_;
      uStack_7cc = SUB84(local_728._8_8_,4);
      local_7e8 = local_738._0_4_;
      uStack_7e4 = local_738._4_4_;
      uStack_7e0 = (uint)pnStack_730;
      uStack_7dc = (uint)((ulong)pnStack_730 >> 0x20);
      iStack_7a8 = iStack_6f8;
      cStack_7a4 = bStack_6f4;
      local_7a0._0_4_ = (fpclass_type)local_6f0;
      local_7a0._4_4_ = local_6f0._4_4_;
      local_6f0._0_4_ = cpp_dec_float_finite;
      local_6f0._4_4_ = 0x10;
      local_738 = (undefined1  [8])0x0;
      pnStack_730 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                     *)0x0;
      local_728[0] = 0;
      local_728[1] = 0;
      local_728[2] = 0;
      local_728[3] = 0;
      local_728[4] = 0;
      local_728[5] = 0;
      local_728[6] = 0;
      local_728[7] = 0;
      local_728[8] = 0;
      local_728[9] = 0;
      stack0xfffffffffffff900 = 0;
      uStack_6fb = 0;
      iStack_6f8 = 0;
      bStack_6f4 = false;
      local_578._0_8_ = &local_688;
      local_578._8_8_ = (add_immediates *)&local_7e8;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                  *)local_738,
                 (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)local_578,(subtract_immediates *)&local_308);
      unique0x10001d2c = uStack_6fb;
      _uStack_750 = stack0xfffffffffffff900;
      local_788 = (type)local_738;
      pnStack_780 = pnStack_730;
      local_778 = local_728[0];
      uStack_774 = local_728[1];
      uStack_770 = local_728[2];
      uStack_76c = local_728[3];
      local_768 = local_728[4];
      uStack_764 = local_728[5];
      uStack_760 = local_728[6];
      uStack_75c = local_728[7];
      local_758 = local_728[8];
      uStack_754 = local_728[9];
      local_748 = iStack_6f8;
      local_744 = bStack_6f4;
      local_740 = (fpclass_type)local_6f0;
      iStack_73c = local_6f0._4_4_;
      local_448 = (type)local_738;
      pnStack_440 = pnStack_730;
      local_438[0] = local_728[0];
      local_438[1] = local_728[1];
      auStack_430[0] = local_728[2];
      auStack_430[1] = local_728[3];
      local_428[0] = local_728[4];
      local_428[1] = local_728[5];
      auStack_420[0] = local_728[6];
      auStack_420[1] = local_728[7];
      local_418[0] = local_728[8];
      local_418[1] = local_728[9];
      local_408 = iStack_6f8;
      local_404 = bStack_6f4;
      local_400 = (fpclass_type)local_6f0;
      local_3fc = local_6f0._4_4_;
      auStack_410 = (uint  [2])_uStack_750;
      anon_unknown.dwarf_d4794::
      func<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::operator()((autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_1UL>
                    *)local_738,
                   (func<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                    *)local_1c8,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_448);
      local_5c8._0_8_ = &local_788;
      local_7a0._0_4_ = cpp_dec_float_finite;
      local_7a0._4_4_ = 0x10;
      local_7e8 = 0;
      uStack_7e4 = 0;
      uStack_7e0 = 0;
      uStack_7dc = 0;
      local_7d8 = 0;
      uStack_7d4 = 0;
      uStack_7d0 = 0;
      uStack_7cc = 0;
      local_7c8 = 0;
      uStack_7c4 = 0;
      uStack_7c0 = 0;
      uStack_7bc = 0;
      local_7b8 = 0;
      uStack_7b4 = 0;
      uStack_7b0 = 0;
      uStack_7ab = 0;
      iStack_7a8 = 0;
      cStack_7a4 = '\0';
      local_5c8._8_8_ = &local_688;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                  *)&local_7e8,
                 (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)local_5c8,(subtract_immediates *)local_578);
      local_528[1] = uStack_7e0;
      local_528[0] = uStack_7e4;
      auStack_520[1] = local_7d8;
      auStack_520[0] = uStack_7dc;
      local_518[1] = uStack_7d0;
      local_518[0] = uStack_7d4;
      auStack_510[1] = local_7c8;
      auStack_510[0] = uStack_7cc;
      local_508[1] = uStack_7c0;
      local_508[0] = uStack_7c4;
      auStack_4f4[1]._1_3_ = uStack_7ab;
      auStack_4f4._0_5_ = uStack_7b0;
      uStack_500 = uStack_7bc;
      uStack_4fc = local_7b8;
      uStack_4f8 = uStack_7b4;
      local_358.neg = (bool)cStack_7a4;
      if (cStack_7a4 == '\x01') {
        local_358.neg = (fpclass_type)local_7a0 == cpp_dec_float_finite && local_7e8 == 0;
      }
      local_358.data._M_elems[0] = local_7e8;
      local_358.data._M_elems[0xd] = uStack_7b4;
      local_358.data._M_elems[0xb] = uStack_7bc;
      local_358.data._M_elems[0xc] = local_7b8;
      local_358.exp = iStack_7a8;
      local_358.fpclass = (fpclass_type)local_7a0;
      local_358.prec_elem = local_7a0._4_4_;
      local_308.m_backend.prec_elem = local_688.base.m_backend.prec_elem;
      local_308.m_backend.fpclass = local_688.base.m_backend.fpclass;
      local_308.m_backend.neg = local_688.base.m_backend.neg;
      if (local_688.base.m_backend.neg == true) {
        local_308.m_backend.neg =
             local_688.base.m_backend.fpclass == cpp_dec_float_finite &&
             local_688.base.m_backend.data._M_elems[0] == 0;
      }
      local_308.m_backend.data._M_elems[0] = local_688.base.m_backend.data._M_elems[0];
      local_308.m_backend.data._M_elems[2] = local_688.base.m_backend.data._M_elems[2];
      local_308.m_backend.data._M_elems[1] = local_688.base.m_backend.data._M_elems[1];
      local_308.m_backend.data._M_elems[4] = local_688.base.m_backend.data._M_elems[4];
      local_308.m_backend.data._M_elems[3] = local_688.base.m_backend.data._M_elems[3];
      local_308.m_backend.data._M_elems[6] = local_688.base.m_backend.data._M_elems[6];
      local_308.m_backend.data._M_elems[5] = local_688.base.m_backend.data._M_elems[5];
      local_308.m_backend.data._M_elems[8] = local_688.base.m_backend.data._M_elems[8];
      local_308.m_backend.data._M_elems[7] = local_688.base.m_backend.data._M_elems[7];
      local_308.m_backend.data._M_elems[10] = local_688.base.m_backend.data._M_elems[10];
      local_308.m_backend.data._M_elems[9] = local_688.base.m_backend.data._M_elems[9];
      local_308.m_backend.data._M_elems[0xd] = local_688.base.m_backend.data._M_elems[0xd];
      local_308.m_backend.data._M_elems[0xe] = local_688.base.m_backend.data._M_elems[0xe];
      local_308.m_backend.data._M_elems[0xf] = local_688.base.m_backend.data._M_elems[0xf];
      local_308.m_backend.data._M_elems[0xb] = local_688.base.m_backend.data._M_elems[0xb];
      local_308.m_backend.data._M_elems[0xc] = local_688.base.m_backend.data._M_elems[0xc];
      local_308.m_backend.exp = local_688.base.m_backend.exp;
      local_4e8.arg1 = 2;
      local_4e8.arg2 = &local_308;
      local_7a0._0_4_ = cpp_dec_float_finite;
      local_7a0._4_4_ = 0x10;
      local_7e8 = 0;
      uStack_7e4 = 0;
      uStack_7e0 = 0;
      uStack_7dc = 0;
      local_7d8 = 0;
      uStack_7d4 = 0;
      uStack_7d0 = 0;
      uStack_7cc = 0;
      local_7c8 = 0;
      uStack_7c4 = 0;
      uStack_7c0 = 0;
      uStack_7bc = 0;
      local_7b8 = 0;
      uStack_7b4 = 0;
      uStack_7b0 = 0;
      uStack_7ab = 0;
      iStack_7a8 = 0;
      cStack_7a4 = 0;
      local_358.data._M_elems._4_8_ = local_528;
      local_358.data._M_elems._12_8_ = auStack_520;
      local_358.data._M_elems._20_8_ = local_518;
      local_358.data._M_elems._28_8_ = auStack_510;
      local_358.data._M_elems._36_8_ = local_508;
      local_358.data._M_elems._56_8_ = auStack_4f4._0_8_;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                  *)&local_7e8,&local_4e8,(multiply_immediates *)local_498);
      local_578._0_8_ = CONCAT44(uStack_7e4,local_7e8);
      local_578._8_8_ = CONCAT44(uStack_7dc,uStack_7e0);
      local_568[1] = uStack_7d4;
      local_568[0] = local_7d8;
      auStack_560[1] = uStack_7cc;
      auStack_560[0] = uStack_7d0;
      local_558[1] = uStack_7c4;
      local_558[0] = local_7c8;
      auStack_550[1] = uStack_7bc;
      auStack_550[0] = uStack_7c0;
      local_548[1] = uStack_7b4;
      local_548[0] = local_7b8;
      auStack_540[1]._1_3_ = uStack_7ab;
      auStack_540._0_5_ = uStack_7b0;
      local_538 = iStack_7a8;
      local_534 = (bool)cStack_7a4;
      local_530 = (fpclass_type)local_7a0;
      iStack_52c = local_7a0._4_4_;
      pcVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::eps();
      local_4e8.arg1 = (pcVar13->data)._M_elems[0];
      local_4e8._4_4_ = (pcVar13->data)._M_elems[1];
      local_4e8.arg2 = *(type *)((pcVar13->data)._M_elems + 2);
      local_4d8 = *(undefined8 *)((pcVar13->data)._M_elems + 4);
      uStack_4d0 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
      local_4c8 = *(undefined8 *)((pcVar13->data)._M_elems + 8);
      uStack_4c0 = *(undefined8 *)((pcVar13->data)._M_elems + 10);
      local_4b8 = *(undefined8 *)((pcVar13->data)._M_elems + 0xc);
      uStack_4b0 = *(undefined8 *)((pcVar13->data)._M_elems + 0xe);
      local_4a8 = pcVar13->exp;
      local_4a4 = pcVar13->neg;
      local_4a0._0_4_ = pcVar13->fpclass;
      local_4a0._4_4_ = pcVar13->prec_elem;
      local_498._0_8_ = local_578;
      local_7a0._0_4_ = cpp_dec_float_finite;
      local_7a0._4_4_ = 0x10;
      local_7e8 = 0;
      uStack_7e4 = 0;
      uStack_7e0 = 0;
      uStack_7dc = 0;
      local_7d8 = 0;
      uStack_7d4 = 0;
      uStack_7d0 = 0;
      uStack_7cc = 0;
      local_7c8 = 0;
      uStack_7c4 = 0;
      uStack_7c0 = 0;
      uStack_7bc = 0;
      local_7b8 = 0;
      uStack_7b4 = 0;
      uStack_7b0 = 0;
      uStack_7ab = 0;
      iStack_7a8 = 0;
      cStack_7a4 = 0;
      unique0x10002e0c = &local_4e8;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                  *)&local_7e8,
                 (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)local_498,(multiply_immediates *)local_218);
      local_5c8._0_8_ = CONCAT44(uStack_7e4,local_7e8);
      local_5c8._8_8_ = CONCAT44(uStack_7dc,uStack_7e0);
      local_5b8[1] = uStack_7d4;
      local_5b8[0] = local_7d8;
      auStack_5b0[1] = uStack_7cc;
      auStack_5b0[0] = uStack_7d0;
      local_5a8[1] = uStack_7c4;
      local_5a8[0] = local_7c8;
      auStack_5a0[1] = uStack_7bc;
      auStack_5a0[0] = uStack_7c0;
      local_598[1] = uStack_7b4;
      local_598[0] = local_7b8;
      auStack_590[1]._1_3_ = uStack_7ab;
      auStack_590._0_5_ = uStack_7b0;
      local_588 = iStack_7a8;
      local_584 = (bool)cStack_7a4;
      local_580 = (fpclass_type)local_7a0;
      iStack_57c = local_7a0._4_4_;
      if ((fpclass_type)local_7a0 != cpp_dec_float_NaN && local_358.fpclass != cpp_dec_float_NaN) {
        iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_358,(cpp_dec_float<100U,_int,_void> *)local_5c8);
        if (-1 < iVar12) goto LAB_00150ec6;
LAB_00151212:
        local_5e8 = local_790 + 1;
        local_608 = local_758;
        uStack_604 = uStack_754;
        uStack_600 = uStack_750;
        uStack_5fc = uStack_74c;
        local_618 = local_768;
        uStack_614 = uStack_764;
        uStack_610 = uStack_760;
        uStack_60c = uStack_75c;
        local_628 = local_778;
        uStack_624 = uStack_774;
        uStack_620 = uStack_770;
        uStack_61c = uStack_76c;
        iStack_5ec = iStack_73c;
        local_5f0 = local_740;
        goto LAB_00151286;
      }
LAB_00150ec6:
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
      ::derivative<int>((get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_1UL>,_sizeof___(Orders)>
                         *)local_218,
                        (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
                         *)local_738,0);
      local_454 = (bool)local_1d4;
      if (local_1d4 == '\x01') {
        local_454 = (fpclass_type)_local_1d0 == cpp_dec_float_finite && local_218[0] == 0;
      }
      local_498._0_4_ = local_218[0];
      auStack_460[0] = auStack_1e0[0];
      auStack_460[1] = auStack_1e0[1];
      auStack_474[0] = local_1f4[0];
      auStack_474[1] = local_1f4[1];
      local_484[0] = local_204[0];
      local_484[1] = local_204[1];
      auStack_47c[0] = auStack_1fc[0];
      auStack_47c[1] = auStack_1fc[1];
      local_498._4_4_ = (undefined4)local_218._4_8_;
      local_498._8_4_ = SUB84(local_218._4_8_,4);
      uStack_48c = (uint)local_218._12_8_;
      uStack_488 = SUB84(local_218._12_8_,4);
      local_458 = local_1d8;
      local_450 = local_1d0;
      iStack_44c = iStack_1cc;
      pcVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::eps();
      local_3f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pcVar13->data)._M_elems;
      local_3f8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 2);
      local_3f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
      local_3f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 6);
      local_3f8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
      local_3f8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 10);
      local_3f8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 0xc);
      local_3f8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 0xe);
      local_3f8.m_backend.exp = pcVar13->exp;
      local_3f8.m_backend.neg = pcVar13->neg;
      local_3f8.m_backend.fpclass = pcVar13->fpclass;
      local_3f8.m_backend.prec_elem = pcVar13->prec_elem;
      local_5d8.arg1 = 2;
      local_5d8.arg2 = &local_3f8;
      local_7a0._0_4_ = cpp_dec_float_finite;
      local_7a0._4_4_ = 0x10;
      local_7e8 = 0;
      uStack_7e4 = 0;
      uStack_7e0 = 0;
      uStack_7dc = 0;
      local_7d8 = 0;
      uStack_7d4 = 0;
      uStack_7d0 = 0;
      uStack_7cc = 0;
      local_7c8 = 0;
      uStack_7c4 = 0;
      uStack_7c0 = 0;
      uStack_7bc = 0;
      local_7b8 = 0;
      uStack_7b4 = 0;
      uStack_7b0 = 0;
      uStack_7ab = 0;
      iStack_7a8 = 0;
      cStack_7a4 = 0;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                  *)&local_7e8,&local_5d8,&local_7e9);
      uVar8._5_3_ = uStack_7ab;
      uVar8._0_5_ = uStack_7b0;
      local_3a8.data._M_elems[0] = local_7e8;
      local_3a8.data._M_elems[1] = uStack_7e4;
      local_3a8.data._M_elems[2] = uStack_7e0;
      local_3a8.data._M_elems[3] = uStack_7dc;
      local_3a8.data._M_elems[4] = local_7d8;
      local_3a8.data._M_elems[5] = uStack_7d4;
      local_3a8.data._M_elems[6] = uStack_7d0;
      local_3a8.data._M_elems[7] = uStack_7cc;
      local_3a8.data._M_elems[8] = local_7c8;
      local_3a8.data._M_elems[9] = uStack_7c4;
      local_3a8.data._M_elems[10] = uStack_7c0;
      local_3a8.data._M_elems[0xb] = uStack_7bc;
      local_3a8.data._M_elems[0xc] = local_7b8;
      local_3a8.data._M_elems[0xd] = uStack_7b4;
      local_3a8.data._M_elems[0xe] = (uint)uStack_7b0;
      local_3a8.data._M_elems[0xf] = SUB84(uVar8,4);
      local_3a8.exp = iStack_7a8;
      local_3a8.neg = (bool)cStack_7a4;
      local_3a8.fpclass = (fpclass_type)local_7a0;
      local_3a8.prec_elem = local_7a0._4_4_;
      if ((fpclass_type)local_7a0 != cpp_dec_float_NaN && local_450 != cpp_dec_float_NaN) {
        iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           ((cpp_dec_float<100U,_int,_void> *)local_498,&local_3a8);
        if (iVar12 < 0) goto LAB_00151212;
      }
      local_688.base.m_backend.data._M_elems[0xc] = (uint)_local_758;
      local_688.base.m_backend.data._M_elems[0xd] = SUB84(_local_758,4);
      local_688.base.m_backend.data._M_elems[0xe] = uStack_750;
      local_688.base.m_backend.data._M_elems[0xf] = uStack_74c;
      uVar8 = local_688.base.m_backend.data._M_elems._56_8_;
      local_688.base.m_backend.data._M_elems[8] = (uint)_local_768;
      local_688.base.m_backend.data._M_elems[9] = SUB84(_local_768,4);
      local_688.base.m_backend.data._M_elems[10] = (uint)_uStack_760;
      local_688.base.m_backend.data._M_elems[0xb] = SUB84(_uStack_760,4);
      local_688.base.m_backend.data._M_elems[4] = (uint)_local_778;
      local_688.base.m_backend.data._M_elems[5] = SUB84(_local_778,4);
      local_688.base.m_backend.data._M_elems[6] = (uint)_uStack_770;
      local_688.base.m_backend.data._M_elems[7] = SUB84(_uStack_770,4);
      local_688.base.m_backend.data._M_elems[0] = (uint)local_788;
      local_688.base.m_backend.data._M_elems[1] = (uint)((ulong)local_788 >> 0x20);
      local_688.base.m_backend.data._M_elems[2] = (uint)pnStack_780;
      local_688.base.m_backend.data._M_elems[3] = (uint)((ulong)pnStack_780 >> 0x20);
      local_688.base.m_backend.exp = local_748;
      local_688.base.m_backend.neg = (bool)local_744;
      local_688.base.m_backend.fpclass = local_740;
      local_688.base.m_backend.prec_elem = iStack_73c;
      lVar16 = 0x48;
      do {
        uVar1 = *(undefined8 *)((long)&pnStack_780 + lVar16);
        uVar2 = *(undefined8 *)((long)&local_778 + lVar16);
        uVar3 = *(undefined8 *)((long)&uStack_770 + lVar16);
        uVar4 = *(undefined8 *)((long)&local_768 + lVar16);
        uVar5 = *(undefined8 *)((long)&uStack_760 + lVar16);
        uVar6 = *(undefined8 *)((long)&local_758 + lVar16);
        uVar7 = *(undefined8 *)((long)&local_748 + lVar16);
        *(undefined8 *)((long)local_308.m_backend.data._M_elems + lVar16 + 0x38) =
             *(undefined8 *)((long)&uStack_750 + lVar16);
        *(undefined8 *)((long)(&local_308.m_backend.data + 1) + lVar16) = uVar7;
        *(undefined8 *)((long)local_308.m_backend.data._M_elems + lVar16 + 0x28) = uVar5;
        *(undefined8 *)((long)local_308.m_backend.data._M_elems + lVar16 + 0x30) = uVar6;
        *(undefined8 *)((long)local_308.m_backend.data._M_elems + lVar16 + 0x18) = uVar3;
        *(undefined8 *)((long)local_308.m_backend.data._M_elems + lVar16 + 0x20) = uVar4;
        *(undefined8 *)((long)local_308.m_backend.data._M_elems + lVar16 + 8) = uVar1;
        *(undefined8 *)((long)local_308.m_backend.data._M_elems + lVar16 + 0x10) = uVar2;
        *(undefined4 *)((long)(&local_308.m_backend.data + 1) + lVar16 + 8) =
             *(undefined4 *)((long)&local_740 + lVar16);
        *(undefined1 *)((long)(&local_308.m_backend.data + 1) + lVar16 + 0xc) =
             *(undefined1 *)((long)&iStack_73c + lVar16);
        *(undefined8 *)(local_2b8 + lVar16) = *(undefined8 *)(local_738 + lVar16);
        lVar16 = lVar16 + 0x50;
      } while (lVar16 != 0xe8);
      lVar16 = local_790 + 1;
    } while (lVar16 != 0x100);
    local_688.base.m_backend.data._M_elems[0xe] = (uint)_uStack_750;
    local_688.base.m_backend.data._M_elems[0xf] = SUB84(_uStack_750,4);
    local_608 = local_688.base.m_backend.data._M_elems[0xc];
    uStack_604 = local_688.base.m_backend.data._M_elems[0xd];
    uStack_600 = local_688.base.m_backend.data._M_elems[0xe];
    uStack_5fc = local_688.base.m_backend.data._M_elems[0xf];
    local_618 = local_688.base.m_backend.data._M_elems[8];
    uStack_614 = local_688.base.m_backend.data._M_elems[9];
    uStack_610 = local_688.base.m_backend.data._M_elems[10];
    uStack_60c = local_688.base.m_backend.data._M_elems[0xb];
    local_628 = local_688.base.m_backend.data._M_elems[4];
    uStack_624 = local_688.base.m_backend.data._M_elems[5];
    uStack_620 = local_688.base.m_backend.data._M_elems[6];
    uStack_61c = local_688.base.m_backend.data._M_elems[7];
    iStack_5ec = iStack_73c;
    local_5f0 = local_740;
    local_5e8 = 0;
    local_688.base.m_backend.data._M_elems._56_8_ = uVar8;
LAB_00151286:
    pmVar9 = local_690;
    local_638 = local_788;
    pnStack_630 = pnStack_780;
    local_5f8 = local_748;
    local_5f4 = (bool)local_744;
    if (local_5e8 != 0) {
      operator/(local_690,1,
                (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                 *)&local_638);
      return pmVar9;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"convergence error");
    puVar15 = &std::runtime_error::typeinfo;
    pcVar14 = std::runtime_error::~runtime_error;
  }
  __cxa_throw(this_00,puVar15,pcVar14);
}

Assistant:

inline T square(T Jx, T Jy) {
  Jx = abs(Jx);
  Jy = abs(Jy);
  if (Jx * Jy <= 0) throw(std::invalid_argument("Jx * Jy should be non-zero"));
  auto result = standards::newton_1d(func<T>(Jx, Jy), 1 / (2 * (Jx + Jy)));
  if (!result.second) throw(std::runtime_error("convergence error"));
  return 1 / result.first;
}